

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O3

bool __thiscall
sptk::StatisticsAccumulation::GetCorrelation
          (StatisticsAccumulation *this,Buffer *buffer,SymmetricMatrix *correlation)

{
  double dVar1;
  double dVar2;
  double dVar3;
  pointer pdVar4;
  bool bVar5;
  double *pdVar6;
  int j;
  long lVar7;
  long lVar8;
  long lVar9;
  vector<double,_std::allocator<double>_> standard_deviation;
  vector<double,_std::allocator<double>_> local_78;
  Row local_60;
  Row local_48;
  
  bVar5 = false;
  if ((this->is_valid_ == true) && (1 < this->num_statistics_order_)) {
    bVar5 = false;
    if ((correlation != (SymmetricMatrix *)0x0) && (bVar5 = false, this->diagonal_ == false)) {
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      bVar5 = GetStandardDeviation(this,buffer,&local_78);
      if ((bVar5) &&
         (bVar5 = GetFullCovariance(this,buffer,correlation),
         pdVar4 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start, bVar5)) {
        if (this->num_order_ < 0) {
          bVar5 = true;
        }
        else {
          lVar9 = 1;
          lVar8 = 0;
          do {
            lVar7 = 0;
            do {
              local_48._vptr_Row = (_func_int **)&PTR__Row_00117bb0;
              local_48.matrix_ = correlation;
              local_48.row_ = (int)lVar8;
              pdVar6 = SymmetricMatrix::Row::operator[](&local_48,(int)lVar7);
              dVar1 = *pdVar6;
              dVar2 = pdVar4[lVar8];
              dVar3 = pdVar4[lVar7];
              local_60._vptr_Row = (_func_int **)&PTR__Row_00117bb0;
              local_60.matrix_ = correlation;
              local_60.row_ = (int)lVar8;
              pdVar6 = SymmetricMatrix::Row::operator[](&local_60,(int)lVar7);
              *pdVar6 = dVar1 / (dVar2 * dVar3);
              lVar7 = lVar7 + 1;
            } while (lVar9 != lVar7);
            lVar9 = lVar9 + 1;
            bVar5 = lVar8 < this->num_order_;
            lVar8 = lVar8 + 1;
          } while (bVar5);
          bVar5 = true;
        }
      }
      else {
        bVar5 = false;
      }
      if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  return bVar5;
}

Assistant:

bool StatisticsAccumulation::GetCorrelation(
    const StatisticsAccumulation::Buffer& buffer,
    SymmetricMatrix* correlation) const {
  if (!is_valid_ || num_statistics_order_ < 2 || diagonal_ ||
      NULL == correlation) {
    return false;
  }

  std::vector<double> standard_deviation;
  if (!GetStandardDeviation(buffer, &standard_deviation)) {
    return false;
  }
  if (!GetFullCovariance(buffer, correlation)) {
    return false;
  }

  const double* sigma(&(standard_deviation[0]));
  for (int i(0); i <= num_order_; ++i) {
    for (int j(0); j <= i; ++j) {
      (*correlation)[i][j] = (*correlation)[i][j] / (sigma[i] * sigma[j]);
    }
  }

  return true;
}